

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfRelocator.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
MipsElfRelocator::generateCtorStub
          (MipsElfRelocator *this,vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *ctors
          )

{
  long lVar1;
  char *args;
  long *in_RDX;
  long lVar2;
  long lVar3;
  string *this_00;
  unsigned_long *in_R9;
  size_t i;
  ulong uVar4;
  initializer_list<AssemblyTemplateArgument> variables;
  initializer_list<AssemblyTemplateArgument> variables_00;
  allocator<char> local_259;
  __uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_258;
  string table;
  Identifier local_230;
  Identifier local_210;
  unsigned_long local_1f0;
  Identifier local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [40];
  char *local_180;
  string local_178;
  char *local_158;
  string local_150 [32];
  char *local_130;
  string local_128 [32];
  char *local_108;
  string local_100 [32];
  Parser parser;
  
  Parser::Parser(&parser);
  lVar2 = *in_RDX;
  lVar1 = in_RDX[1];
  if (lVar1 == lVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"jr ra :: nop",(allocator<char> *)&table);
    variables_00._M_len = 0;
    variables_00._M_array = (iterator)local_1a8;
    Parser::parseTemplate((Parser *)this,(string *)&parser,variables_00);
    this_00 = (string *)local_1a8;
  }
  else {
    table._M_dataplus._M_p = (pointer)&table.field_2;
    table._M_string_length = 0;
    table.field_2._M_local_buf[0] = '\0';
    lVar3 = 0x20;
    local_258._M_t.
    super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
    super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
         (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)
         (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)this;
    for (uVar4 = 0; uVar4 < (ulong)((lVar1 - lVar2) / 0x28); uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        std::__cxx11::string::push_back((char)&table);
        lVar2 = *in_RDX;
      }
      args = (char *)(lVar2 + lVar3 + -0x20);
      tinyformat::format<Identifier,Identifier,unsigned_long>
                ((string *)local_1a8,(tinyformat *)"%s,%s+0x%08X",args,(Identifier *)args,
                 (Identifier *)(lVar2 + lVar3),in_R9);
      std::__cxx11::string::append((string *)&table);
      std::__cxx11::string::~string((string *)local_1a8);
      lVar2 = *in_RDX;
      lVar1 = in_RDX[1];
      lVar3 = lVar3 + 0x28;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,mipsCtorTemplate,&local_259);
    local_1a8._0_8_ = "%ctorTable%";
    SymbolTable::getUniqueLabelName(&local_1e8,&Global.symbolTable,false);
    std::__cxx11::string::string((string *)(local_1a8 + 8),(string *)&local_1e8);
    local_180 = "%ctorTableSize%";
    local_1f0 = (in_RDX[1] - *in_RDX) / 0x28 << 3;
    tinyformat::format<unsigned_long>(&local_178,"%d",&local_1f0);
    local_158 = "%outerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_210,&Global.symbolTable,false);
    std::__cxx11::string::string(local_150,(string *)&local_210);
    local_130 = "%innerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_230,&Global.symbolTable,false);
    std::__cxx11::string::string(local_128,(string *)&local_230);
    this = (MipsElfRelocator *)
           local_258._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    local_108 = "%ctorContent%";
    std::__cxx11::string::string(local_100,(string *)&table);
    variables._M_len = (size_type)local_1a8;
    variables._M_array = (iterator)local_1c8;
    Parser::parseTemplate((Parser *)this,(string *)&parser,variables);
    lVar2 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)(local_1a8 + lVar2));
      lVar2 = lVar2 + -0x28;
    } while (lVar2 != -0x20);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)local_1c8);
    this_00 = &table;
  }
  std::__cxx11::string::~string((string *)this_00);
  Parser::~Parser(&parser);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (tuple<CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>)this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> MipsElfRelocator::generateCtorStub(std::vector<ElfRelocatorCtor>& ctors)
{
	Parser parser;
	if (ctors.size() != 0)
	{
		// create constructor table
		std::string table;
		for (size_t i = 0; i < ctors.size(); i++)
		{
			if (i != 0)
				table += ',';
			table += tfm::format("%s,%s+0x%08X",ctors[i].symbolName,ctors[i].symbolName,ctors[i].size);
		}

		return parser.parseTemplate(mipsCtorTemplate,{
			{ "%ctorTable%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorTableSize%",	tfm::format("%d",ctors.size()*8) },
			{ "%outerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%innerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorContent%",		table },
		});
	} else {
		return parser.parseTemplate("jr ra :: nop");
	}
}